

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O2

ggml_status __thiscall
llama_context::graph_compute(llama_context *this,ggml_cgraph *gf,bool batched)

{
  int iVar1;
  ggml_threadpool_t pgVar2;
  pointer ppVar3;
  ggml_status gVar4;
  undefined8 uVar5;
  code *pcVar6;
  undefined7 in_register_00000011;
  pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)> *set_n_threads_fn;
  pointer ppVar7;
  
  iVar1 = (&(this->cparams).n_threads)[CONCAT71(in_register_00000011,batched) & 0xffffffff];
  if (this->backend_cpu != (ggml_backend_t)0x0) {
    pgVar2 = (&this->threadpool)[batched];
    uVar5 = ggml_backend_get_device();
    uVar5 = ggml_backend_dev_backend_reg(uVar5);
    pcVar6 = (code *)ggml_backend_reg_get_proc_address(uVar5,"ggml_backend_cpu_set_threadpool");
    (*pcVar6)(this->backend_cpu,pgVar2);
  }
  ppVar3 = (this->set_n_threads_fns).
           super__Vector_base<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>,_std::allocator<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar7 = (this->set_n_threads_fns).
                super__Vector_base<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>,_std::allocator<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar3; ppVar7 = ppVar7 + 1) {
    (*ppVar7->second)(ppVar7->first,iVar1);
  }
  gVar4 = ggml_backend_sched_graph_compute_async
                    ((this->sched)._M_t.
                     super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                     super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                     super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,gf);
  if (gVar4 != GGML_STATUS_SUCCESS) {
    llama_log_internal(GGML_LOG_LEVEL_ERROR,
                       "%s: ggml_backend_sched_graph_compute_async failed with error %d\n",
                       "graph_compute",(ulong)(uint)gVar4);
  }
  return gVar4;
}

Assistant:

ggml_status llama_context::graph_compute(
            ggml_cgraph * gf,
                   bool   batched) {
    int n_threads        = batched ? cparams.n_threads_batch : cparams.n_threads;
    ggml_threadpool_t tp = batched ? threadpool_batch        : threadpool;

    if (backend_cpu != nullptr) {
        auto * reg = ggml_backend_dev_backend_reg(ggml_backend_get_device(backend_cpu));
        auto * set_threadpool_fn = (decltype(ggml_backend_cpu_set_threadpool) *) ggml_backend_reg_get_proc_address(reg, "ggml_backend_cpu_set_threadpool");
        set_threadpool_fn(backend_cpu, tp);
    }

    // set the number of threads for all the backends
    for (const auto & set_n_threads_fn : set_n_threads_fns) {
        set_n_threads_fn.second(set_n_threads_fn.first, n_threads);
    }

    auto status = ggml_backend_sched_graph_compute_async(sched.get(), gf);
    if (status != GGML_STATUS_SUCCESS) {
        LLAMA_LOG_ERROR("%s: ggml_backend_sched_graph_compute_async failed with error %d\n", __func__, status);
    }

    // fprintf(stderr, "splits: %d\n", ggml_backend_sched_get_n_splits(sched));

    return status;
}